

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall
dg::vr::GraphBuilder::buildSwitch(GraphBuilder *this,SwitchInst *swtch,VRLocation *last)

{
  uint uVar1;
  mapped_type pVVar2;
  VRLocation *this_00;
  sockaddr *psVar3;
  Value *pVVar4;
  ConstantInt *pCVar5;
  mapped_type *ppVVar6;
  socklen_t __len;
  undefined **ppuVar7;
  undefined **local_60;
  CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock> local_50;
  GraphBuilder *local_40;
  BasicBlock *local_38;
  
  uVar1 = *(uint *)(swtch + 0x14);
  local_50.Index = 0;
  ppuVar7 = &PTR__VROp_00150d00;
  local_60 = &PTR__VROp_00150d00;
  local_50.SI = swtch;
  local_40 = this;
  while( true ) {
    __len = (socklen_t)ppuVar7;
    if (local_50.Index == (ulong)((uVar1 >> 1 & 0x3ffffff) - 1)) break;
    this_00 = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(local_40 + 8));
    psVar3 = (sockaddr *)operator_new(0x20);
    pVVar4 = llvm::SwitchInst::getCondition(swtch);
    pCVar5 = llvm::SwitchInst::
             CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>
             ::getCaseValue(&local_50);
    psVar3->sa_data[6] = '\x03';
    psVar3->sa_data[7] = '\0';
    psVar3->sa_data[8] = '\0';
    psVar3->sa_data[9] = '\0';
    *(Value **)(psVar3 + 1) = pVVar4;
    *(undefined ***)psVar3 = &PTR__VROp_00150d40;
    *(ConstantInt **)(psVar3[1].sa_data + 6) = pCVar5;
    VRLocation::connect(last,(int)this_00,psVar3,__len);
    local_38 = llvm::SwitchInst::
               CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>
               ::getCaseSuccessor(&local_50);
    ppVVar6 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                            *)(this + 0x10),&local_38);
    pVVar2 = *ppVVar6;
    psVar3 = (sockaddr *)operator_new(0x10);
    psVar3->sa_data[6] = '\0';
    psVar3->sa_data[7] = '\0';
    psVar3->sa_data[8] = '\0';
    psVar3->sa_data[9] = '\0';
    *(undefined ***)psVar3 = &PTR__VROp_00150d00;
    ppuVar7 = local_60;
    VRLocation::connect(this_00,(int)pVVar2,psVar3,0x150d00);
    local_50.Index = local_50.Index + 1;
  }
  local_50.SI = (SwitchInst *)llvm::SwitchInst::getDefaultDest(swtch);
  ppVVar6 = std::
            map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
            ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                          *)(this + 0x10),(key_type *)&local_50);
  pVVar2 = *ppVVar6;
  psVar3 = (sockaddr *)operator_new(0x10);
  psVar3->sa_data[6] = '\0';
  psVar3->sa_data[7] = '\0';
  psVar3->sa_data[8] = '\0';
  psVar3->sa_data[9] = '\0';
  *(undefined ***)psVar3 = &PTR__VROp_00150d00;
  VRLocation::connect(last,(int)pVVar2,psVar3,0x150d00);
  return;
}

Assistant:

void GraphBuilder::buildSwitch(const llvm::SwitchInst *swtch,
                               VRLocation &last) {
    for (auto &it : swtch->cases()) {
        VRLocation &padding = codeGraph.newVRLocation();

        last.connect(padding, new VRAssumeEqual(swtch->getCondition(),
                                                it.getCaseValue()));

        assert(fronts.find(it.getCaseSuccessor()) != fronts.end());
        VRLocation &first = *fronts[it.getCaseSuccessor()];

        padding.connect(first, new VRNoop());
    }

    assert(fronts.find(swtch->getDefaultDest()) != fronts.end());
    VRLocation &first = *fronts[swtch->getDefaultDest()];
    last.connect(first, new VRNoop());
}